

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall Client::Client(Client *this,string *alias)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->terminate_client = false;
  this->send_to_server = false;
  this->rcv_from_server = false;
  this->client_rcv = false;
  memset(this->buffer,0,0x120);
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

Client::Client(std::string alias)
{
    name = alias;
}